

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleIntervalFunc1 *func,Interval *arg0)

{
  Interval local_50;
  Interval local_38;
  
  (*func)(&local_38,arg0->m_lo);
  (*func)(&local_50,arg0->m_hi);
  if (local_38.m_hasNaN != false) {
    local_50.m_hasNaN = true;
  }
  __return_storage_ptr__->m_hasNaN = local_50.m_hasNaN;
  __return_storage_ptr__->m_lo =
       (double)(~-(ulong)(local_38.m_lo <= local_50.m_lo) & (ulong)local_50.m_lo |
               (ulong)local_38.m_lo & -(ulong)(local_38.m_lo <= local_50.m_lo));
  __return_storage_ptr__->m_hi =
       (double)(~-(ulong)(local_50.m_hi <= local_38.m_hi) & (ulong)local_50.m_hi |
               (ulong)local_38.m_hi & -(ulong)(local_50.m_hi <= local_38.m_hi));
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleIntervalFunc1& func, const Interval& arg0)
{
	return Interval(func(arg0.lo()), func(arg0.hi()));
}